

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viplanner.cpp
# Opt level: O0

CMDPSTATE * __thiscall VIPlanner::GetState(VIPlanner *this,int stateID)

{
  size_type sVar1;
  undefined8 uVar2;
  reference ppiVar3;
  reference ppCVar4;
  int in_ESI;
  long *in_RDI;
  char *in_stack_ffffffffffffffb8;
  SBPL_Exception *in_stack_ffffffffffffffc0;
  vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *this_00;
  value_type local_8;
  
  sVar1 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8));
  if ((int)sVar1 <= in_ESI) {
    uVar2 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                      ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8),(long)in_ESI);
  if (**ppiVar3 == -1) {
    local_8 = (value_type)(**(code **)(*in_RDI + 0xb0))(in_RDI,in_ESI);
  }
  else {
    this_00 = (vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RDI + 3);
    ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8),(long)in_ESI);
    ppCVar4 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        (this_00,(long)**ppiVar3);
    local_8 = *ppCVar4;
  }
  return local_8;
}

Assistant:

CMDPSTATE* VIPlanner::GetState(int stateID)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        throw SBPL_Exception("ERROR in GetState: stateID is invalid");
    }

    if (environment_->StateID2IndexMapping[stateID][VIMDP_STATEID2IND] == -1)
        return CreateState(stateID);
    else
        return viPlanner.MDP.StateArray[environment_->StateID2IndexMapping[stateID][VIMDP_STATEID2IND]];
}